

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O0

BigNumber * operator-(BigNumber *__return_storage_ptr__,BigNumber *nb1,BigNumber *nb2)

{
  uint uVar1;
  value_type vVar2;
  unsigned_long uVar3;
  bool bVar4;
  ulong uVar5;
  unsigned_long *puVar6;
  size_type sVar7;
  reference pvVar8;
  uint local_94;
  unsigned_long local_90;
  unsigned_long local_88;
  unsigned_long local_80;
  int local_78;
  uint local_74;
  size_type local_70;
  size_type local_68;
  uint local_5c;
  int local_58;
  uint i;
  int retenue;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  undefined1 local_21;
  BigNumber *local_20;
  BigNumber *nb2_local;
  BigNumber *nb1_local;
  BigNumber *tmp;
  
  local_21 = 0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_20 = nb2;
  nb2_local = nb1;
  nb1_local = __return_storage_ptr__;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48);
  BigNumber::BigNumber(__return_storage_ptr__,&local_48,nb2->m_base);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_48);
  local_58 = 0;
  bVar4 = operator>(nb1,nb2);
  if (bVar4) {
    local_5c = 0;
    while( true ) {
      uVar5 = (ulong)local_5c;
      local_68 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)nb1);
      local_70 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)nb2);
      puVar6 = std::max<unsigned_long>(&local_68,&local_70);
      if (*puVar6 <= uVar5) break;
      uVar5 = (ulong)local_5c;
      sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)nb1);
      if ((uVar5 < sVar7) &&
         (uVar5 = (ulong)local_5c,
         sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)nb2),
         uVar5 < sVar7)) {
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)nb1,
                            (ulong)local_5c);
        uVar1 = *pvVar8;
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)nb2,
                            (ulong)local_5c);
        if (uVar1 < *pvVar8) {
          uVar3 = nb1->m_base;
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)nb2,
                              (ulong)local_5c);
          local_88 = (uVar3 - *pvVar8) - (long)local_58;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_long>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__return_storage_ptr__,
                     &local_88);
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)nb1,
                              (ulong)local_5c);
          vVar2 = *pvVar8;
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              __return_storage_ptr__,(ulong)local_5c);
          *pvVar8 = vVar2 + *pvVar8;
          local_58 = 1;
        }
        else if ((local_58 == 0) ||
                (uVar3 = nb2->m_base,
                pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)nb2,
                                    (ulong)local_5c), uVar3 - *pvVar8 != 1)) {
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)nb1,
                              (ulong)local_5c);
          vVar2 = *pvVar8;
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)nb2,
                              (ulong)local_5c);
          if (vVar2 == *pvVar8) {
            pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)nb1,
                                (ulong)local_5c);
            if (*pvVar8 == 0) {
              local_78 = 0;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         __return_storage_ptr__,&local_78);
            }
            else {
              local_80 = nb1->m_base * (long)local_58 - (long)local_58;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_long>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         __return_storage_ptr__,&local_80);
            }
          }
          else {
            pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)nb1,
                                (ulong)local_5c);
            vVar2 = *pvVar8;
            pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)nb2,
                                (ulong)local_5c);
            local_74 = (vVar2 - *pvVar8) - local_58;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__return_storage_ptr__
                       ,&local_74);
            local_58 = 0;
          }
        }
        else {
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)nb1,
                              (ulong)local_5c);
          std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                     pvVar8);
          local_58 = 1;
        }
      }
      else {
        uVar5 = (ulong)local_5c;
        sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)nb1);
        if (uVar5 < sVar7) {
          if (local_58 == 0) {
            pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)nb1,
                                (ulong)local_5c);
            std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                       pvVar8);
          }
          else {
            pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)nb1,
                                (ulong)local_5c);
            if (*pvVar8 == 0) {
              local_90 = nb1->m_base - 1;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_long>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         __return_storage_ptr__,&local_90);
            }
            else {
              pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)nb1,
                                  (ulong)local_5c);
              local_94 = *pvVar8 - 1;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         __return_storage_ptr__,&local_94);
              local_58 = 0;
            }
          }
        }
      }
      local_5c = local_5c + 1;
    }
    BigNumber::m_format(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

BigNumber operator - (BigNumber nb1, BigNumber nb2) {
    /*
     * TODO : A refaire ^^
     */
//    clock_t t1, t2;
//    static clock_t t_tmp;
//    static unsigned int cmp = 0;
//    t1 = clock();
    BigNumber tmp ({}, nb2.m_base);
    int retenue = 0;
    if(nb1 > nb2) {
        for (unsigned int i = 0; i < max(nb1.m_coef.size(), nb2.m_coef.size()); i++) {
            if (i < nb1.m_coef.size() && i < nb2.m_coef.size()) {
                if (nb1.m_coef[i] >= nb2.m_coef[i]) {
                    if (retenue && nb2.m_base - nb2.m_coef[i] == 1) {
                        tmp.m_coef.emplace_back(nb1.m_coef[i]);
                        retenue = 1;
                    } else {
                        if (nb1.m_coef[i] != nb2.m_coef[i]) {
                            tmp.m_coef.emplace_back(nb1.m_coef[i] - nb2.m_coef[i] - retenue);
                            retenue = 0;
                        } else if (nb1.m_coef[i] == 0) {
                            tmp.m_coef.emplace_back(0);
                        } else {
                            tmp.m_coef.emplace_back(nb1.m_base * retenue - retenue);
                        }

                    }

                } else {
                    tmp.m_coef.emplace_back(nb1.m_base - nb2.m_coef[i] - retenue);
                    tmp.m_coef[i] += nb1.m_coef[i];
                    retenue = 1;
                }
            } else if (i < nb1.m_coef.size()) {
                if (retenue == 0) {
                    tmp.m_coef.emplace_back(nb1.m_coef[i]);
                } else {
                    if (nb1.m_coef[i] == 0) {
                        tmp.m_coef.emplace_back(nb1.m_base - 1);
                    } else {
                        tmp.m_coef.emplace_back(nb1.m_coef[i] - 1);
                        retenue = 0;
                    }
                }

            }
        }
        tmp.m_format();
    }


//    t2 = clock();
//    t_tmp += (t2 - t1);
//    cmp += 1;
//    cout << " Soustraction : " << t_tmp << endl;
    return tmp;
}